

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O0

uint32_t slang::clog2(SVInt *v)

{
  logic_t lVar1;
  bool bVar2;
  bitwidth_t bVar3;
  bitwidth_t bVar4;
  SVInt *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  SVInt *in_stack_ffffffffffffff90;
  SVInt *this;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  SVInt *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  this = in_RDI;
  SVInt::SVInt<int>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  lVar1 = SVInt::operator==(in_stack_ffffffffffffffb8,
                            (SVInt *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  bVar2 = logic_t::operator_cast_to_bool((logic_t *)in_stack_ffffffffffffff90);
  SVInt::~SVInt(this);
  if (bVar2) {
    local_4 = 0;
  }
  else {
    bVar3 = SVInt::getBitWidth(in_RDI);
    SVInt::operator-(in_stack_ffffffffffffffb8,
                     (SVInt *)CONCAT17(lVar1.value,in_stack_ffffffffffffffb0));
    bVar4 = SVInt::countLeadingZeros((SVInt *)CONCAT44(bVar3,in_stack_ffffffffffffff88));
    local_4 = bVar3 - bVar4;
    SVInt::~SVInt(this);
  }
  return local_4;
}

Assistant:

inline SLANG_EXPORT uint32_t clog2(const SVInt& v) {
    if (v == 0)
        return 0;
    return v.getBitWidth() - (v - SVInt::One).countLeadingZeros();
}